

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitArrayNewElem
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,
          ArrayNewElem *curr)

{
  bool bVar1;
  ExpressionRunner<wasm::ModuleRunner> *pEVar2;
  long lVar3;
  long lVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  size_type sVar7;
  const_reference ppEVar8;
  Literal *pLVar9;
  Name NVar10;
  Literal local_1b0;
  Flow local_198;
  undefined1 local_150 [8];
  Literal val;
  Index i;
  uint64_t end;
  ElementSegment *seg;
  Literals contents;
  uint64_t size;
  uint64_t offset;
  Flow sizeFlow;
  undefined1 local_68 [8];
  Flow offsetFlow;
  ArrayNewElem *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  offsetFlow.breakTo.super_IString.str._M_str = (char *)curr;
  pEVar2 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_68,pEVar2,
             *(Expression **)(offsetFlow.breakTo.super_IString.str._M_str + 0x20));
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
    sizeFlow.breakTo.super_IString.str._M_str._0_4_ = 1;
  }
  else {
    pEVar2 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&offset,pEVar2,
               *(Expression **)(offsetFlow.breakTo.super_IString.str._M_str + 0x28));
    bVar1 = Flow::breaking((Flow *)&offset);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,(Flow *)&offset);
      sizeFlow.breakTo.super_IString.str._M_str._0_4_ = 1;
    }
    else {
      Flow::getSingleValue((Flow *)local_68);
      lVar3 = ::wasm::Literal::getUnsigned();
      Flow::getSingleValue((Flow *)&offset);
      contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)::wasm::Literal::getUnsigned();
      Literals::Literals((Literals *)&seg);
      NVar10.super_IString.str._M_str =
           *(char **)(offsetFlow.breakTo.super_IString.str._M_str + 0x10);
      NVar10.super_IString.str._M_len = (size_t)this->wasm;
      lVar4 = ::wasm::Module::getElementSegment(NVar10);
      puVar5 = ((contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage)->field_0).v128 + lVar3;
      puVar6 = (uint8_t *)
               std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                         ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                          (lVar4 + 0x38));
      if (puVar6 < puVar5) {
        (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                  (this,"out of bounds segment access in array.new_elem");
      }
      if (puVar5 != (uint8_t *)0x0) {
        sVar7 = std::
                unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                ::count(&this->droppedElementSegments,
                        (key_type *)(offsetFlow.breakTo.super_IString.str._M_str + 0x10));
        if (sVar7 != 0) {
          (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                    (this,"out of bounds segment access in array.new_elem");
        }
      }
      SmallVector<wasm::Literal,_1UL>::reserve
                ((SmallVector<wasm::Literal,_1UL> *)&seg,
                 (size_t)contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
                         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
      for (val.type.id._4_4_ = (uint)lVar3; (uint8_t *)(ulong)val.type.id._4_4_ < puVar5;
          val.type.id._4_4_ = val.type.id._4_4_ + 1) {
        pEVar2 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
        ppEVar8 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             (lVar4 + 0x38),(ulong)val.type.id._4_4_);
        ExpressionRunner<wasm::ModuleRunner>::visit(&local_198,pEVar2,*ppEVar8);
        pLVar9 = Flow::getSingleValue(&local_198);
        ::wasm::Literal::Literal((Literal *)local_150,pLVar9);
        Flow::~Flow(&local_198);
        SmallVector<wasm::Literal,_1UL>::push_back
                  ((SmallVector<wasm::Literal,_1UL> *)&seg,(Literal *)local_150);
        ::wasm::Literal::~Literal((Literal *)local_150);
      }
      pEVar2 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
      ExpressionRunner<wasm::ModuleRunner>::makeGCData
                (&local_1b0,pEVar2,(Literals *)&seg,
                 (Type)*(uintptr_t *)(offsetFlow.breakTo.super_IString.str._M_str + 8));
      Flow::Flow(__return_storage_ptr__,&local_1b0);
      ::wasm::Literal::~Literal(&local_1b0);
      sizeFlow.breakTo.super_IString.str._M_str._0_4_ = 1;
      Literals::~Literals((Literals *)&seg);
    }
    Flow::~Flow((Flow *)&offset);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitArrayNewElem(ArrayNewElem* curr) {
    NOTE_ENTER("ArrayNewElem");
    auto offsetFlow = self()->visit(curr->offset);
    if (offsetFlow.breaking()) {
      return offsetFlow;
    }
    auto sizeFlow = self()->visit(curr->size);
    if (sizeFlow.breaking()) {
      return sizeFlow;
    }

    uint64_t offset = offsetFlow.getSingleValue().getUnsigned();
    uint64_t size = sizeFlow.getSingleValue().getUnsigned();

    Literals contents;

    const auto& seg = *wasm.getElementSegment(curr->segment);
    auto end = offset + size;
    if (end > seg.data.size()) {
      trap("out of bounds segment access in array.new_elem");
    }
    if (end > 0 && droppedElementSegments.count(curr->segment)) {
      trap("out of bounds segment access in array.new_elem");
    }
    contents.reserve(size);
    for (Index i = offset; i < end; ++i) {
      auto val = self()->visit(seg.data[i]).getSingleValue();
      contents.push_back(val);
    }
    return self()->makeGCData(std::move(contents), curr->type);
  }